

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNLLex.cpp
# Opt level: O2

void __thiscall SNLLex::sourceStream(SNLLex *this)

{
  string sourceCode;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&this->fileName);
  readFileAsString(&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  while ((ulong)(long)this->cursor < local_50._M_string_length) {
    skipWhiteChar(this,&local_50);
    if (local_50._M_string_length <= (ulong)(long)this->cursor) break;
    this->curState = 0;
    resolveToken(this,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void SNLLex::sourceStream() {
    string sourceCode = readFileAsString(this->fileName);
    while (cursor < sourceCode.length()) {
        skipWhiteChar(sourceCode);
        if (cursor >= sourceCode.length()) {
            return;
        }
        resetState();
        resolveToken(sourceCode);
    }
}